

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt * __thiscall llvm::APInt::operator-=(APInt *this,APInt *RHS)

{
  uint uVar1;
  uint64_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t *puVar5;
  ulong uVar6;
  APInt *pAVar7;
  uint i;
  ulong uVar8;
  uint64_t uVar9;
  bool bVar10;
  
  uVar1 = this->BitWidth;
  if (uVar1 == RHS->BitWidth) {
    if (uVar1 < 0x41) {
      puVar5 = (uint64_t *)((long)(this->U).pVal - (RHS->U).VAL);
      (this->U).pVal = puVar5;
      pAVar7 = this;
    }
    else {
      puVar5 = (this->U).pVal;
      puVar2 = (RHS->U).pVal;
      uVar6 = (ulong)uVar1 + 0x3f >> 6;
      uVar8 = 0;
      bVar10 = false;
      do {
        uVar3 = puVar5[uVar8];
        uVar4 = puVar2[uVar8];
        if (bVar10) {
          uVar9 = ~uVar4 + uVar3;
          bVar10 = uVar3 <= uVar9;
        }
        else {
          bVar10 = uVar3 < uVar4;
          uVar9 = uVar3 - uVar4;
        }
        puVar5[uVar8] = uVar9;
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
      pAVar7 = (APInt *)((this->U).pVal + ((int)uVar6 - 1));
      puVar5 = (uint64_t *)(pAVar7->U).VAL;
    }
    (pAVar7->U).VAL = (ulong)((long)puVar5 << (-(char)uVar1 & 0x3fU)) >> (-(char)uVar1 & 0x3fU);
    return this;
  }
  __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0xd5,"APInt &llvm::APInt::operator-=(const APInt &)");
}

Assistant:

APInt& APInt::operator-=(const APInt& RHS) {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  if (isSingleWord())
    U.VAL -= RHS.U.VAL;
  else
    tcSubtract(U.pVal, RHS.U.pVal, 0, getNumWords());
  return clearUnusedBits();
}